

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O0

Dogstatsd * __thiscall
datadog::Dogstatsd::format
          (Dogstatsd *this,string *name,string *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pbVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  iterator it;
  ostringstream local_1b8 [8];
  ostringstream statd;
  bool tagging;
  double rate_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_local;
  string *value_local;
  string *name_local;
  Dogstatsd *this_local;
  
  bVar1 = false;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar3 = std::operator<<((ostream *)local_1b8,(string *)value);
  poVar3 = std::operator<<(poVar3,":");
  std::operator<<(poVar3,(string *)tags);
  if (rate < 1.0) {
    poVar3 = std::operator<<((ostream *)local_1b8,"|@");
    std::ostream::operator<<(poVar3,rate);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_R8);
  if (sVar4 != 0) {
    bVar1 = true;
    local_1d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_R8);
    poVar3 = std::operator<<((ostream *)local_1b8,"|#");
    local_1d8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_1d0,0);
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_1d8);
    std::operator<<(poVar3,(string *)pbVar5);
    while( true ) {
      local_1e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_R8);
      bVar2 = __gnu_cxx::operator!=(&local_1d0,&local_1e0);
      if (!bVar2) break;
      poVar3 = std::operator<<((ostream *)local_1b8,",");
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1d0);
      std::operator<<(poVar3,(string *)pbVar5);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1d0);
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    if (bVar1) {
      std::operator<<((ostream *)local_1b8,",");
    }
    else {
      std::operator<<((ostream *)local_1b8,"|#");
    }
    std::operator<<((ostream *)local_1b8,(string *)(name + 0x40));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return this;
}

Assistant:

std::string Dogstatsd::format( std::string name, std::string value, std::vector<std::string> tags, double rate){
    bool tagging = false;
    std::ostringstream statd;

    statd << name << ":" << value;
    if (rate < 1) {
      statd << "|@" << rate;
    }

    if (tags.size()) {
      tagging = true;
      // TODO: remove newlines from the tags.
      std::vector<std::string>::iterator it = tags.begin();

      statd << "|#" << *it++;
      for( ; it != tags.end() ; ++it) {
        statd << "," << *it;
      }
    }

    if (!global_tags_str.empty()) {
      if (!tagging) {
        statd << "|#" ;
      } else {
        statd << "," ;
      }
      statd << global_tags_str;
    }
    return statd.str();
  }